

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeNF
          (ChElementBeamANCF_3243 *this,double xi,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  undefined8 uVar1;
  double dVar2;
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  PVar3;
  double *pdVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  undefined8 *puVar15;
  double *pdVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  *src;
  undefined1 auVar19 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  double dVar28;
  double dVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  VectorN G_B;
  VectorN G_A;
  VectorN Sxi_compact;
  ChMatrix33<double> J_Cxi_Inv;
  MatrixNx3c Sxi_D;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  double dStack_558;
  double *local_550;
  double local_548 [6];
  double local_518;
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  assign_op<double,_double> local_400 [64];
  undefined1 local_3c0 [64];
  VectorN local_380;
  Matrix<double,_3,_3,_1,_3,_3> local_310;
  undefined1 local_2c0 [128];
  undefined1 local_240 [64];
  Matrix<double,_8,_3,_1,_8,_3> local_200;
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  local_140 [4];
  
  local_500._0_8_ = xi;
  local_550 = detJ;
  Calc_Sxi_compact(this,&local_380,xi,0.0,0.0);
  lVar14 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (2 < lVar14) {
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_data = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    src = local_140;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_rows.m_value = 3;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_startRow.m_value = 0;
    local_140[0].m_lhs = &local_380;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
         F;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_outerStride = lVar14;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Product<Eigen::Matrix<double,8,1,0,8,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              (&local_200,src,(assign_op<double,_double> *)local_2c0,(type)0x0);
    pdVar16 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x18) {
      if (pdVar16 != (double *)0x0) {
        free((void *)pdVar16[-1]);
      }
      pvVar12 = malloc(0x100);
      if (pvVar12 == (void *)0x0) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)(((ulong)pvVar12 & 0xffffffffffffffc0) + 0x38) = pvVar12;
      pdVar16 = (double *)(((ulong)pvVar12 & 0xffffffffffffffc0) + 0x40);
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar16;
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x18;
    }
    uVar13 = 0xfffffffffffffff8;
    do {
      dVar28 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar13 + 9];
      dVar31 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar13 + 10];
      dVar2 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array[uVar13 + 0xb];
      dVar8 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array[uVar13 + 0xc];
      dVar9 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array[uVar13 + 0xd];
      dVar10 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar13 + 0xe];
      dVar11 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar13 + 0xf];
      pdVar4 = pdVar16 + uVar13 + 8;
      *pdVar4 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar13 + 8];
      pdVar4[1] = dVar28;
      pdVar4[2] = dVar31;
      pdVar4[3] = dVar2;
      pdVar4[4] = dVar8;
      pdVar4[5] = dVar9;
      pdVar4[6] = dVar10;
      pdVar4[7] = dVar11;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0x10);
    CalcCoordMatrix(this,(Matrix3xN *)src);
    Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,(double)local_500._0_8_,0.0,0.0);
    lVar14 = 0x10;
    do {
      PVar3 = *src;
      src = src + 1;
      auVar22 = vmulpd_avx512f((undefined1  [64])PVar3,local_2c0._0_64_);
      auVar19 = vextractf64x4_avx512f(auVar22,1);
      auVar23 = vmulpd_avx512f((undefined1  [64])PVar3,local_2c0._64_64_);
      auVar24 = vmulpd_avx512f((undefined1  [64])PVar3,local_240);
      auVar20 = vextractf64x4_avx512f(auVar23,1);
      auVar21 = vextractf64x4_avx512f(auVar24,1);
      *(double *)((long)&dStack_558 + lVar14) =
           auVar22._0_8_ + auVar19._0_8_ + auVar22._8_8_ + auVar19._8_8_ +
           auVar22._16_8_ + auVar19._16_8_ + auVar22._24_8_ + auVar19._24_8_;
      *(double *)((long)local_548 + lVar14 + -8) =
           auVar23._0_8_ + auVar20._0_8_ + auVar23._8_8_ + auVar20._8_8_ +
           auVar23._16_8_ + auVar20._16_8_ + auVar23._24_8_ + auVar20._24_8_;
      dVar28 = auVar24._0_8_ + auVar21._0_8_ + auVar24._8_8_ + auVar21._8_8_;
      dVar31 = auVar24._16_8_ + auVar21._16_8_ + auVar24._24_8_ + auVar21._24_8_;
      auVar29._0_8_ = dVar28 + dVar31;
      auVar29._8_8_ = dVar28 + dVar31;
      uVar1 = vmovlpd_avx(auVar29);
      *(undefined8 *)((long)local_548 + lVar14) = uVar1;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x58);
    local_4c0 = local_2c0._0_64_;
    local_480 = local_2c0._64_64_;
    local_500 = local_240;
    local_3c0._0_8_ = local_548;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_310,(SrcXprType *)local_3c0,local_400);
    auVar22._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22 = vmulpd_avx512f(local_4c0,auVar22);
    auVar23._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23 = vmulpd_avx512f(local_480,auVar23);
    auVar24._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24 = vmulpd_avx512f(local_500,auVar24);
    auVar25._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25 = vmulpd_avx512f(local_4c0,auVar25);
    auVar26._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26 = vmulpd_avx512f(local_4c0,auVar26);
    auVar22 = vaddpd_avx512f(auVar22,auVar23);
    auVar27._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar27._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar27._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar27._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar27._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar27._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar27._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar27._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar23 = vmulpd_avx512f(local_480,auVar27);
    auVar5._8_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
    auVar5._0_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
    auVar5._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar5._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar5._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar5._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar5._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar5._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar27 = vmulpd_avx512f(local_480,auVar5);
    local_3c0 = vaddpd_avx512f(auVar22,auVar24);
    auVar22 = vaddpd_avx512f(auVar25,auVar23);
    auVar6._8_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
    auVar6._0_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
    auVar6._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar6._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar6._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar6._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar6._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar6._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar23 = vmulpd_avx512f(local_500,auVar6);
    auVar24 = vaddpd_avx512f(auVar26,auVar27);
    auVar22 = vaddpd_avx512f(auVar22,auVar23);
    local_400[0] = (assign_op<double,_double>)auVar22[0];
    local_400[1] = (assign_op<double,_double>)auVar22[1];
    local_400[2] = (assign_op<double,_double>)auVar22[2];
    local_400[3] = (assign_op<double,_double>)auVar22[3];
    local_400[4] = (assign_op<double,_double>)auVar22[4];
    local_400[5] = (assign_op<double,_double>)auVar22[5];
    local_400[6] = (assign_op<double,_double>)auVar22[6];
    local_400[7] = (assign_op<double,_double>)auVar22[7];
    local_400[8] = (assign_op<double,_double>)auVar22[8];
    local_400[9] = (assign_op<double,_double>)auVar22[9];
    local_400[10] = (assign_op<double,_double>)auVar22[10];
    local_400[0xb] = (assign_op<double,_double>)auVar22[0xb];
    local_400[0xc] = (assign_op<double,_double>)auVar22[0xc];
    local_400[0xd] = (assign_op<double,_double>)auVar22[0xd];
    local_400[0xe] = (assign_op<double,_double>)auVar22[0xe];
    local_400[0xf] = (assign_op<double,_double>)auVar22[0xf];
    local_400[0x10] = (assign_op<double,_double>)auVar22[0x10];
    local_400[0x11] = (assign_op<double,_double>)auVar22[0x11];
    local_400[0x12] = (assign_op<double,_double>)auVar22[0x12];
    local_400[0x13] = (assign_op<double,_double>)auVar22[0x13];
    local_400[0x14] = (assign_op<double,_double>)auVar22[0x14];
    local_400[0x15] = (assign_op<double,_double>)auVar22[0x15];
    local_400[0x16] = (assign_op<double,_double>)auVar22[0x16];
    local_400[0x17] = (assign_op<double,_double>)auVar22[0x17];
    local_400[0x18] = (assign_op<double,_double>)auVar22[0x18];
    local_400[0x19] = (assign_op<double,_double>)auVar22[0x19];
    local_400[0x1a] = (assign_op<double,_double>)auVar22[0x1a];
    local_400[0x1b] = (assign_op<double,_double>)auVar22[0x1b];
    local_400[0x1c] = (assign_op<double,_double>)auVar22[0x1c];
    local_400[0x1d] = (assign_op<double,_double>)auVar22[0x1d];
    local_400[0x1e] = (assign_op<double,_double>)auVar22[0x1e];
    local_400[0x1f] = (assign_op<double,_double>)auVar22[0x1f];
    local_400[0x20] = (assign_op<double,_double>)auVar22[0x20];
    local_400[0x21] = (assign_op<double,_double>)auVar22[0x21];
    local_400[0x22] = (assign_op<double,_double>)auVar22[0x22];
    local_400[0x23] = (assign_op<double,_double>)auVar22[0x23];
    local_400[0x24] = (assign_op<double,_double>)auVar22[0x24];
    local_400[0x25] = (assign_op<double,_double>)auVar22[0x25];
    local_400[0x26] = (assign_op<double,_double>)auVar22[0x26];
    local_400[0x27] = (assign_op<double,_double>)auVar22[0x27];
    local_400[0x28] = (assign_op<double,_double>)auVar22[0x28];
    local_400[0x29] = (assign_op<double,_double>)auVar22[0x29];
    local_400[0x2a] = (assign_op<double,_double>)auVar22[0x2a];
    local_400[0x2b] = (assign_op<double,_double>)auVar22[0x2b];
    local_400[0x2c] = (assign_op<double,_double>)auVar22[0x2c];
    local_400[0x2d] = (assign_op<double,_double>)auVar22[0x2d];
    local_400[0x2e] = (assign_op<double,_double>)auVar22[0x2e];
    local_400[0x2f] = (assign_op<double,_double>)auVar22[0x2f];
    local_400[0x30] = (assign_op<double,_double>)auVar22[0x30];
    local_400[0x31] = (assign_op<double,_double>)auVar22[0x31];
    local_400[0x32] = (assign_op<double,_double>)auVar22[0x32];
    local_400[0x33] = (assign_op<double,_double>)auVar22[0x33];
    local_400[0x34] = (assign_op<double,_double>)auVar22[0x34];
    local_400[0x35] = (assign_op<double,_double>)auVar22[0x35];
    local_400[0x36] = (assign_op<double,_double>)auVar22[0x36];
    local_400[0x37] = (assign_op<double,_double>)auVar22[0x37];
    local_400[0x38] = (assign_op<double,_double>)auVar22[0x38];
    local_400[0x39] = (assign_op<double,_double>)auVar22[0x39];
    local_400[0x3a] = (assign_op<double,_double>)auVar22[0x3a];
    local_400[0x3b] = (assign_op<double,_double>)auVar22[0x3b];
    local_400[0x3c] = (assign_op<double,_double>)auVar22[0x3c];
    local_400[0x3d] = (assign_op<double,_double>)auVar22[0x3d];
    local_400[0x3e] = (assign_op<double,_double>)auVar22[0x3e];
    local_400[0x3f] = (assign_op<double,_double>)auVar22[0x3f];
    auVar7._8_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    auVar7._0_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    auVar7._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar7._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar7._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar7._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar7._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar7._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar22 = vmulpd_avx512f(local_500,auVar7);
    local_440 = vaddpd_avx512f(auVar24,auVar22);
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar16 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar13 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      uVar17 = 2;
      lVar14 = 0;
      pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar18._8_8_ = 0x3fe0000000000000;
      auVar18._0_8_ = 0x3fe0000000000000;
      auVar18 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar16 + 3),auVar18);
      dVar28 = pdVar16[5] * 0.5;
      auVar29 = vshufpd_avx(auVar18,auVar18,1);
      while ((long)(uVar17 - 2) < (long)uVar13) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(double *)(local_400 + lVar14);
        dVar31 = *(double *)(local_440 + lVar14);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar31;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(double *)(local_400 + lVar14) * -dVar28;
        auVar34 = vfmadd231sd_fma(auVar37,auVar29,auVar34);
        pdVar4[uVar17 - 2] = auVar34._0_8_ + pdVar4[uVar17 - 2];
        if (uVar13 <= uVar17 - 1) break;
        dVar2 = *(double *)(local_3c0 + lVar14);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar2;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar28;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar31 * -auVar18._0_8_;
        auVar34 = vfmadd231sd_fma(auVar35,auVar32,auVar38);
        pdVar4[uVar17 - 1] = auVar34._0_8_ + pdVar4[uVar17 - 1];
        if (uVar13 <= uVar17) break;
        lVar14 = lVar14 + 8;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar2 * -auVar29._0_8_;
        auVar34 = vfmadd213sd_fma(auVar33,auVar18,auVar36);
        pdVar4[uVar17] = auVar34._0_8_ + pdVar4[uVar17];
        uVar17 = uVar17 + 3;
        if (uVar17 == 0x1a) {
          auVar30._8_8_ = 0;
          auVar30._0_8_ =
               local_548[0] * local_548[0] + local_548[3] * local_548[3] + local_518 * local_518;
          auVar29 = vsqrtsd_avx(auVar30,auVar30);
          *local_550 = auVar29._0_8_;
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamANCF_3243::ComputeNF(
    const double xi,             // parametric coordinate along the beam axis
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, 0, 0);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential length and the normalized differential length.  The vector 2 norm is used to calculate this
    //  length ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.col(0).norm();
}